

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O1

void TestFastDtoaShortestVariousDoubles(void)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff78;
  undefined8 uVar12;
  int local_80;
  undefined1 local_7c [4];
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char local_68;
  
  buffer._8_8_ = local_7c;
  buffer.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,4.94065645841247e-324,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x41;
LAB_00862657:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
           ,uVar3,"status");
    abort();
  }
  if (CONCAT11(cStack_77,local_78) != 0x35) {
    pcVar2 = "\"5\"";
    pcVar4 = "5";
    uVar3 = 0x42;
    goto LAB_008627a3;
  }
  if (local_80 != -0x143) {
    uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "-323";
    uVar3 = 0x43;
    uVar5 = 0xfffffebd;
    goto LAB_008627d9;
  }
  buffer_00._8_8_ = local_7c;
  buffer_00.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,1.79769313486232e+308,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_00,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x48;
    goto LAB_00862657;
  }
  auVar6[0] = -(local_78 == '1');
  auVar6[1] = -(cStack_77 == '7');
  auVar6[2] = -(cStack_76 == '9');
  auVar6[3] = -(cStack_75 == '7');
  auVar6[4] = -(cStack_74 == '6');
  auVar6[5] = -(cStack_73 == '9');
  auVar6[6] = -(cStack_72 == '3');
  auVar6[7] = -(cStack_71 == '1');
  auVar6[8] = -(cStack_70 == '3');
  auVar6[9] = -(cStack_6f == '4');
  auVar6[10] = -(cStack_6e == '8');
  auVar6[0xb] = -(cStack_6d == '6');
  auVar6[0xc] = -(cStack_6c == '2');
  auVar6[0xd] = -(cStack_6b == '3');
  auVar6[0xe] = -(cStack_6a == '1');
  auVar6[0xf] = -(cStack_69 == '5');
  auVar9[0] = -((char)_local_68 == '7');
  auVar9[1] = -((char)((ushort)_local_68 >> 8) == '\0');
  auVar9[2] = 0xff;
  auVar9[3] = 0xff;
  auVar9[4] = 0xff;
  auVar9[5] = 0xff;
  auVar9[6] = 0xff;
  auVar9[7] = 0xff;
  auVar9[8] = 0xff;
  auVar9[9] = 0xff;
  auVar9[10] = 0xff;
  auVar9[0xb] = 0xff;
  auVar9[0xc] = 0xff;
  auVar9[0xd] = 0xff;
  auVar9[0xe] = 0xff;
  auVar9[0xf] = 0xff;
  auVar9 = auVar9 & auVar6;
  if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) {
    pcVar2 = "\"17976931348623157\"";
    pcVar4 = "17976931348623157";
    uVar3 = 0x49;
    goto LAB_008627a3;
  }
  if (local_80 != 0x135) {
    uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "309";
    uVar3 = 0x4a;
    uVar5 = 0x135;
    goto LAB_008627d9;
  }
  buffer_01._8_8_ = local_7c;
  buffer_01.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,4294967272.0,FAST_DTOA_SHORTEST,(int)&local_78,
                     buffer_01,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x4e;
    goto LAB_00862657;
  }
  if (CONCAT17(cStack_6e,
               CONCAT16(cStack_6f,
                        CONCAT15(cStack_70,
                                 CONCAT14(cStack_71,
                                          CONCAT13(cStack_72,
                                                   CONCAT12(cStack_73,CONCAT11(cStack_74,cStack_75))
                                                  ))))) != 0x32373237363934 ||
      CONCAT17(cStack_71,
               CONCAT16(cStack_72,
                        CONCAT15(cStack_73,
                                 CONCAT14(cStack_74,
                                          CONCAT13(cStack_75,
                                                   CONCAT12(cStack_76,CONCAT11(cStack_77,local_78)))
                                         )))) != 0x3237363934393234) {
    pcVar2 = "\"4294967272\"";
    pcVar4 = "4294967272";
    uVar3 = 0x4f;
    goto LAB_008627a3;
  }
  if (local_80 != 10) {
    uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0x50;
LAB_008626b8:
    pcVar2 = "10";
    uVar5 = 10;
    goto LAB_008627d9;
  }
  buffer_02._8_8_ = local_7c;
  buffer_02.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,4.185580496821357e+298,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_02,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x54;
    goto LAB_00862657;
  }
  if ((local_68 != '\0' ||
      CONCAT17(cStack_71,
               CONCAT16(cStack_72,
                        CONCAT15(cStack_73,
                                 CONCAT14(cStack_74,
                                          CONCAT13(cStack_75,
                                                   CONCAT12(cStack_76,CONCAT11(cStack_77,local_78)))
                                         )))) != 0x3430383535383134) ||
      CONCAT17(cStack_69,
               CONCAT16(cStack_6a,
                        CONCAT15(cStack_6b,
                                 CONCAT14(cStack_6c,
                                          CONCAT13(cStack_6d,
                                                   CONCAT12(cStack_6e,CONCAT11(cStack_6f,cStack_70))
                                                  ))))) != 0x3735333132383639) {
    pcVar2 = "\"4185580496821357\"";
    pcVar4 = "4185580496821357";
    uVar3 = 0x55;
    goto LAB_008627a3;
  }
  if (local_80 != 299) {
    uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0x56;
LAB_00862718:
    pcVar2 = "299";
    uVar5 = 299;
    goto LAB_008627d9;
  }
  buffer_03._8_8_ = local_7c;
  buffer_03.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,5.562684646268003e-309,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_03,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x5a;
    goto LAB_00862657;
  }
  if ((local_68 != '\0' ||
      CONCAT17(cStack_71,
               CONCAT16(cStack_72,
                        CONCAT15(cStack_73,
                                 CONCAT14(cStack_74,
                                          CONCAT13(cStack_75,
                                                   CONCAT12(cStack_76,CONCAT11(cStack_77,local_78)))
                                         )))) != 0x3634383632363535) ||
      CONCAT17(cStack_69,
               CONCAT16(cStack_6a,
                        CONCAT15(cStack_6b,
                                 CONCAT14(cStack_6c,
                                          CONCAT13(cStack_6d,
                                                   CONCAT12(cStack_6e,CONCAT11(cStack_6f,cStack_70))
                                                  ))))) != 0x3330303836323634) {
    pcVar2 = "\"5562684646268003\"";
    pcVar4 = "5562684646268003";
    uVar3 = 0x5b;
    goto LAB_008627a3;
  }
  if (local_80 != -0x134) {
    uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "-308";
    uVar3 = 0x5c;
    uVar5 = 0xfffffecc;
    goto LAB_008627d9;
  }
  buffer_04._8_8_ = local_7c;
  buffer_04.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,2147483648.0,FAST_DTOA_SHORTEST,(int)&local_78,
                     buffer_04,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x60;
    goto LAB_00862657;
  }
  if (CONCAT17(cStack_6e,
               CONCAT16(cStack_6f,
                        CONCAT15(cStack_70,
                                 CONCAT14(cStack_71,
                                          CONCAT13(cStack_72,
                                                   CONCAT12(cStack_73,CONCAT11(cStack_74,cStack_75))
                                                  ))))) != 0x38343633383437 ||
      CONCAT17(cStack_71,
               CONCAT16(cStack_72,
                        CONCAT15(cStack_73,
                                 CONCAT14(cStack_74,
                                          CONCAT13(cStack_75,
                                                   CONCAT12(cStack_76,CONCAT11(cStack_77,local_78)))
                                         )))) != 0x3633383437343132) {
    pcVar2 = "\"2147483648\"";
    pcVar4 = "2147483648";
    uVar3 = 0x61;
    goto LAB_008627a3;
  }
  if (local_80 != 10) {
    uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0x62;
    goto LAB_008626b8;
  }
  buffer_05._8_8_ = local_7c;
  buffer_05.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,3.5844466002796428e+298,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_05,&local_80,in_stack_ffffffffffffff78);
  if (bVar1) {
    auVar7[0] = -(local_78 == '3');
    auVar7[1] = -(cStack_77 == '5');
    auVar7[2] = -(cStack_76 == '8');
    auVar7[3] = -(cStack_75 == '4');
    auVar7[4] = -(cStack_74 == '4');
    auVar7[5] = -(cStack_73 == '4');
    auVar7[6] = -(cStack_72 == '6');
    auVar7[7] = -(cStack_71 == '6');
    auVar7[8] = -(cStack_70 == '0');
    auVar7[9] = -(cStack_6f == '0');
    auVar7[10] = -(cStack_6e == '2');
    auVar7[0xb] = -(cStack_6d == '7');
    auVar7[0xc] = -(cStack_6c == '9');
    auVar7[0xd] = -(cStack_6b == '6');
    auVar7[0xe] = -(cStack_6a == '4');
    auVar7[0xf] = -(cStack_69 == '2');
    auVar10[0] = -((char)_local_68 == '8');
    auVar10[1] = -((char)((ushort)_local_68 >> 8) == '\0');
    auVar10[2] = 0xff;
    auVar10[3] = 0xff;
    auVar10[4] = 0xff;
    auVar10[5] = 0xff;
    auVar10[6] = 0xff;
    auVar10[7] = 0xff;
    auVar10[8] = 0xff;
    auVar10[9] = 0xff;
    auVar10[10] = 0xff;
    auVar10[0xb] = 0xff;
    auVar10[0xc] = 0xff;
    auVar10[0xd] = 0xff;
    auVar10[0xe] = 0xff;
    auVar10[0xf] = 0xff;
    auVar10 = auVar10 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
      pcVar2 = "\"35844466002796428\"";
      pcVar4 = "35844466002796428";
      uVar3 = 0x67;
      goto LAB_008627a3;
    }
    if (local_80 != 299) {
      uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      uVar3 = 0x68;
      goto LAB_00862718;
    }
  }
  buffer_06._8_8_ = local_7c;
  buffer_06.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x0,2.2250738585072014e-308,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_06,&local_80,in_stack_ffffffffffffff78);
  if (bVar1) {
    auVar8[0] = -(local_78 == '2');
    auVar8[1] = -(cStack_77 == '2');
    auVar8[2] = -(cStack_76 == '2');
    auVar8[3] = -(cStack_75 == '5');
    auVar8[4] = -(cStack_74 == '0');
    auVar8[5] = -(cStack_73 == '7');
    auVar8[6] = -(cStack_72 == '3');
    auVar8[7] = -(cStack_71 == '8');
    auVar8[8] = -(cStack_70 == '5');
    auVar8[9] = -(cStack_6f == '8');
    auVar8[10] = -(cStack_6e == '5');
    auVar8[0xb] = -(cStack_6d == '0');
    auVar8[0xc] = -(cStack_6c == '7');
    auVar8[0xd] = -(cStack_6b == '2');
    auVar8[0xe] = -(cStack_6a == '0');
    auVar8[0xf] = -(cStack_69 == '1');
    auVar11[0] = -((char)_local_68 == '4');
    auVar11[1] = -((char)((ushort)_local_68 >> 8) == '\0');
    auVar11[2] = 0xff;
    auVar11[3] = 0xff;
    auVar11[4] = 0xff;
    auVar11[5] = 0xff;
    auVar11[6] = 0xff;
    auVar11[7] = 0xff;
    auVar11[8] = 0xff;
    auVar11[9] = 0xff;
    auVar11[10] = 0xff;
    auVar11[0xb] = 0xff;
    auVar11[0xc] = 0xff;
    auVar11[0xd] = 0xff;
    auVar11[0xe] = 0xff;
    auVar11[0xf] = 0xff;
    auVar11 = auVar11 & auVar8;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
      pcVar2 = "\"22250738585072014\"";
      pcVar4 = "22250738585072014";
      uVar3 = 0x6f;
      goto LAB_008627a3;
    }
    if (local_80 == -0x133) goto LAB_0086235e;
    uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0x70;
  }
  else {
LAB_0086235e:
    buffer_07._8_8_ = local_7c;
    buffer_07.start_ = (char *)0x64;
    bVar1 = double_conversion::FastDtoa
                      ((double_conversion *)0x0,2.225073858507201e-308,FAST_DTOA_SHORTEST,
                       (int)&local_78,buffer_07,&local_80,in_stack_ffffffffffffff78);
    if (!bVar1) {
      return;
    }
    if ((local_68 != '\0' ||
        CONCAT17(cStack_71,
                 CONCAT16(cStack_72,
                          CONCAT15(cStack_73,
                                   CONCAT14(cStack_74,
                                            CONCAT13(cStack_75,
                                                     CONCAT12(cStack_76,CONCAT11(cStack_77,local_78)
                                                             )))))) != 0x3833373035323232) ||
        CONCAT17(cStack_69,
                 CONCAT16(cStack_6a,
                          CONCAT15(cStack_6b,
                                   CONCAT14(cStack_6c,
                                            CONCAT13(cStack_6d,
                                                     CONCAT12(cStack_6e,
                                                              CONCAT11(cStack_6f,cStack_70))))))) !=
        0x3130323730353835) {
      pcVar2 = "\"2225073858507201\"";
      pcVar4 = "2225073858507201";
      uVar3 = 0x77;
LAB_008627a3:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
             ,uVar3,pcVar2,"buffer.start()",pcVar4,&local_78);
      abort();
    }
    if (local_80 == -0x133) {
      return;
    }
    uVar12 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0x78;
  }
  pcVar2 = "-307";
  uVar5 = 0xfffffecd;
LAB_008627d9:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
         ,uVar3,pcVar2,"point",uVar5,uVar12);
  abort();
}

Assistant:

TEST(FastDtoaShortestVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  double min_double = 5e-324;
  status = FastDtoa(min_double, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("5", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  status = FastDtoa(max_double, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("17976931348623157", buffer.start());
  CHECK_EQ(309, point);

  status = FastDtoa(4294967272.0, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(4.1855804968213567e298, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("4185580496821357", buffer.start());
  CHECK_EQ(299, point);

  status = FastDtoa(5.5626846462680035e-309, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("5562684646268003", buffer.start());
  CHECK_EQ(-308, point);

  status = FastDtoa(2147483648.0, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.5844466002796428e+298, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  if (status) {  // Not all FastDtoa variants manage to compute this number.
    CHECK_EQ("35844466002796428", buffer.start());
    CHECK_EQ(299, point);
  }

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("22250738585072014", buffer.start());
    CHECK_EQ(-307, point);
  }

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("2225073858507201", buffer.start());
    CHECK_EQ(-307, point);
  }
}